

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalParameterData.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::FundamentalParameterData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,FundamentalParameterData *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Fundamental Parameter Data:",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"\n\tFrequency:                  ",0x1e);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32Freq);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tFrequency Range:            ",0x1e)
  ;
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32FreqRange);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tEffective Radiated Power:   ",0x1e)
  ;
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32EffectiveRadiatedPower);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tPulse Repetition Frequency: ",0x1e)
  ;
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32PulseRepetitionFreq);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tPulse Width:                ",0x1e)
  ;
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32PulseWidth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tBeam Azimuth Center:        ",0x1e)
  ;
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32BeamAzimuthCenter);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tBeam Azimuth Sweep:         ",0x1e)
  ;
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32BeamAzimuthSweep);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tBeam Elevation Center:      ",0x1e)
  ;
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32BeamElevationCenter);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tBeam Elevation Sweep:       ",0x1e)
  ;
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32BeamElevationSweep);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tBeam Sweep Sync:            ",0x1e)
  ;
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32BeamSweepSync);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString FundamentalParameterData::GetAsString() const
{
    KStringStream ss;

    ss << "Fundamental Parameter Data:"
       << "\n\tFrequency:                  " << m_f32Freq
       << "\n\tFrequency Range:            " << m_f32FreqRange
       << "\n\tEffective Radiated Power:   " << m_f32EffectiveRadiatedPower
       << "\n\tPulse Repetition Frequency: " << m_f32PulseRepetitionFreq
       << "\n\tPulse Width:                " << m_f32PulseWidth
       << "\n\tBeam Azimuth Center:        " << m_f32BeamAzimuthCenter
       << "\n\tBeam Azimuth Sweep:         " << m_f32BeamAzimuthSweep
       << "\n\tBeam Elevation Center:      " << m_f32BeamElevationCenter
       << "\n\tBeam Elevation Sweep:       " << m_f32BeamElevationSweep
       << "\n\tBeam Sweep Sync:            " << m_f32BeamSweepSync
       << "\n";

    return ss.str();
}